

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_opaque_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InlineOpaquePass::IsOpaqueType(InlineOpaquePass *this,uint32_t typeId)

{
  Instruction *this_00;
  bool bVar1;
  Op OVar2;
  uint32_t typeId_00;
  DefUseManager *this_01;
  anon_class_8_1_8991fb9c local_50;
  function<bool_(const_unsigned_int_*)> local_48;
  Instruction *local_28;
  Instruction *typeInst;
  InlineOpaquePass *pIStack_18;
  uint32_t typeId_local;
  InlineOpaquePass *this_local;
  
  typeInst._4_4_ = typeId;
  pIStack_18 = this;
  this_01 = Pass::get_def_use_mgr((Pass *)this);
  local_28 = analysis::DefUseManager::GetDef(this_01,typeInst._4_4_);
  OVar2 = Instruction::opcode(local_28);
  if (OVar2 - OpTypeImage < 3) {
    this_local._7_1_ = 1;
  }
  else if (OVar2 == OpTypePointer) {
    typeId_00 = Instruction::GetSingleWordInOperand(local_28,1);
    this_local._7_1_ = IsOpaqueType(this,typeId_00);
  }
  else {
    OVar2 = Instruction::opcode(local_28);
    this_00 = local_28;
    if (OVar2 == OpTypeStruct) {
      local_50.this = this;
      std::function<bool(unsigned_int_const*)>::
      function<spvtools::opt::InlineOpaquePass::IsOpaqueType(unsigned_int)::__0,void>
                ((function<bool(unsigned_int_const*)> *)&local_48,&local_50);
      bVar1 = Instruction::WhileEachInId(this_00,&local_48);
      this_local._7_1_ = (bVar1 ^ 0xffU) & 1;
      std::function<bool_(const_unsigned_int_*)>::~function(&local_48);
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool InlineOpaquePass::IsOpaqueType(uint32_t typeId) {
  const Instruction* typeInst = get_def_use_mgr()->GetDef(typeId);
  switch (typeInst->opcode()) {
    case spv::Op::OpTypeSampler:
    case spv::Op::OpTypeImage:
    case spv::Op::OpTypeSampledImage:
      return true;
    case spv::Op::OpTypePointer:
      return IsOpaqueType(
          typeInst->GetSingleWordInOperand(kTypePointerTypeIdInIdx));
    default:
      break;
  }
  // TODO(greg-lunarg): Handle arrays containing opaque type
  if (typeInst->opcode() != spv::Op::OpTypeStruct) return false;
  // Return true if any member is opaque
  return !typeInst->WhileEachInId([this](const uint32_t* tid) {
    if (IsOpaqueType(*tid)) return false;
    return true;
  });
}